

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

void syms_dump_e(FILE *f,symtbl_t *t)

{
  long lVar1;
  char *pcVar2;
  FILE *in_RSI;
  FILE *in_RDI;
  char *pcVar3;
  sym_t *s;
  uint i;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar4;
  
  if (*(int *)&in_RSI->field_0x4 != 0) {
    fprintf(in_RDI,
            ";-------------------------------------------------------------------------------\n");
  }
  for (uVar4 = 0; uVar4 < *(uint *)&in_RSI->field_0x4; uVar4 = uVar4 + 1) {
    lVar1 = *(long *)(in_RSI->_IO_read_end + (ulong)uVar4 * 8);
    pcVar2 = token_name(*(int *)(lVar1 + 0x20));
    pcVar3 = "";
    if (*(int *)(lVar1 + 0x24) != 0) {
      pcVar3 = "YES";
    }
    fprintf(in_RDI,"; %-31s %-9s %-5s %-6d\n",lVar1,pcVar2,pcVar3,(ulong)(uint)in_RSI->_flags);
  }
  for (uVar4 = 0; uVar4 < *(uint *)&in_RSI->_IO_read_ptr; uVar4 = uVar4 + 1) {
    if (*(long *)(in_RSI->_IO_read_base + (ulong)uVar4 * 8) != 0) {
      syms_dump_e(in_RSI,(symtbl_t *)CONCAT44(uVar4,in_stack_ffffffffffffffe8));
    }
  }
  return;
}

Assistant:

void syms_dump_e(FILE* f, symtbl_t* t)
{
    unsigned int i;
    if (t->num_syms)
        fprintf(f, ";-------------------------------------------------------------------------------\n");
    for (i = 0; i < t->num_syms; i++)
    {
        sym_t* s = t->syms[i];
        fprintf(f, "; %-31s %-9s %-5s %-6d\n", s->id, token_name(s->type_id), s->function ? "YES" : "", t->scope_id);
    }

    for (i = 0; i < t->num_children; i++)
    {
        if (t->children[i])
            syms_dump_e(f, t->children[i]);
    }
}